

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ThreadJoin(SQLiteThread *p,void **ppOut)

{
  int iVar1;
  uint local_24;
  int rc;
  void **ppOut_local;
  SQLiteThread *p_local;
  
  if (p == (SQLiteThread *)0x0) {
    p_local._4_4_ = 7;
  }
  else {
    if (p->done == 0) {
      iVar1 = pthread_join(p->tid,ppOut);
      local_24 = (uint)(iVar1 != 0);
    }
    else {
      *ppOut = p->pOut;
      local_24 = 0;
    }
    sqlite3_free(p);
    p_local._4_4_ = local_24;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ThreadJoin(SQLiteThread *p, void **ppOut){
  int rc;

  assert( ppOut!=0 );
  if( NEVER(p==0) ) return SQLITE_NOMEM_BKPT;
  if( p->done ){
    *ppOut = p->pOut;
    rc = SQLITE_OK;
  }else{
    rc = pthread_join(p->tid, ppOut) ? SQLITE_ERROR : SQLITE_OK;
  }
  sqlite3_free(p);
  return rc;
}